

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

TValue * luaT_gettmbyobj(lua_State *L,TValue *o,TMS event)

{
  TValue *local_38;
  Table *local_28;
  Table *mt;
  TMS event_local;
  TValue *o_local;
  lua_State *L_local;
  
  if (o->tt == 5) {
    local_28 = (((o->value).gc)->h).metatable;
  }
  else if (o->tt == 7) {
    local_28 = (((o->value).gc)->h).metatable;
  }
  else {
    local_28 = L->l_G->mt[o->tt];
  }
  if (local_28 == (Table *)0x0) {
    local_38 = &luaO_nilobject_;
  }
  else {
    local_38 = luaH_getstr(local_28,L->l_G->tmname[event]);
  }
  return local_38;
}

Assistant:

static const TValue*luaT_gettmbyobj(lua_State*L,const TValue*o,TMS event){
Table*mt;
switch(ttype(o)){
case 5:
mt=hvalue(o)->metatable;
break;
case 7:
mt=uvalue(o)->metatable;
break;
default:
mt=G(L)->mt[ttype(o)];
}
return(mt?luaH_getstr(mt,G(L)->tmname[event]):(&luaO_nilobject_));
}